

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O3

void plutovg_path_get_current_point(plutovg_path_t *path,float *x,float *y)

{
  plutovg_path_element_t *ppVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  
  if (path->num_points < 1) {
    fVar4 = 0.0;
    fVar3 = 0.0;
  }
  else {
    ppVar1 = (path->elements).data;
    lVar2 = (long)(path->elements).size;
    fVar4 = (float)ppVar1[lVar2 + -1].header.command;
    fVar3 = *(float *)((long)ppVar1 + lVar2 * 8 + -4);
  }
  if (x != (float *)0x0) {
    *x = fVar4;
  }
  if (y != (float *)0x0) {
    *y = fVar3;
  }
  return;
}

Assistant:

void plutovg_path_get_current_point(const plutovg_path_t* path, float* x, float* y)
{
    float xx = 0.f;
    float yy = 0.f;
    if(path->num_points > 0) {
        xx = path->elements.data[path->elements.size - 1].point.x;
        yy = path->elements.data[path->elements.size - 1].point.y;
    }

    if(x) *x = xx;
    if(y) *y = yy;
}